

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::GeneratedMessageReflection::AddEnumValueInternal
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field,int value)

{
  RepeatedField<int> *this_00;
  int iVar1;
  uint32 uVar2;
  Type TVar3;
  ulong uVar4;
  
  if (field[0x50] == (FieldDescriptor)0x1) {
    uVar2 = ReflectionSchema::GetExtensionSetOffset(&this->schema_);
    iVar1 = *(int *)(field + 0x38);
    TVar3 = FieldDescriptor::type(field);
    ExtensionSet::AddEnum
              ((ExtensionSet *)
               ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2),iVar1,
               (FieldType)TVar3,*(bool *)(*(long *)(field + 0x80) + 0x6c),value,field);
    return;
  }
  uVar2 = ReflectionSchema::GetFieldOffset(&this->schema_,field);
  uVar4 = (ulong)uVar2;
  this_00 = (RepeatedField<int> *)((long)&(message->super_MessageLite)._vptr_MessageLite + uVar4);
  iVar1 = *(int *)((long)&(message->super_MessageLite)._vptr_MessageLite + uVar4 + 4);
  if (*(int *)((long)&(message->super_MessageLite)._vptr_MessageLite + uVar4) == iVar1) {
    RepeatedField<int>::Reserve(this_00,iVar1 + 1);
  }
  iVar1 = this_00->current_size_;
  this_00->current_size_ = iVar1 + 1;
  this_00->rep_->elements[iVar1] = value;
  return;
}

Assistant:

void GeneratedMessageReflection::AddEnumValueInternal(
    Message* message, const FieldDescriptor* field,
    int value) const {
  if (field->is_extension()) {
    MutableExtensionSet(message)->AddEnum(field->number(), field->type(),
                                          field->options().packed(),
                                          value, field);
  } else {
    AddField<int>(message, field, value);
  }
}